

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactBvh.cpp
# Opt level: O3

void __thiscall
cbtBvhTree::_build_sub_tree
          (cbtBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex)

{
  GIM_BVH_DATA *pGVar1;
  undefined8 *puVar2;
  cbtScalar cVar3;
  undefined8 uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  cbtScalar *pcVar11;
  cbtBvhTree *this_00;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  iVar5 = *(int *)this;
  *(int *)this = iVar5 + 1;
  if (endIndex - startIndex == 1) {
    lVar12 = (long)iVar5 * 0x24;
    pGVar1 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data + startIndex;
    uVar4 = *(undefined8 *)((pGVar1->m_bound).m_min.m_floats + 2);
    uVar8 = *(undefined8 *)(pGVar1->m_bound).m_max.m_floats;
    uVar9 = *(undefined8 *)((pGVar1->m_bound).m_max.m_floats + 2);
    puVar2 = (undefined8 *)(*(long *)(this + 0x18) + lVar12);
    *puVar2 = *(undefined8 *)(pGVar1->m_bound).m_min.m_floats;
    puVar2[1] = uVar4;
    puVar2[2] = uVar8;
    puVar2[3] = uVar9;
    *(int *)(*(long *)(this + 0x18) + 0x20 + lVar12) =
         (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data[startIndex].m_data;
  }
  else {
    this_00 = this;
    iVar10 = _calc_splitting_axis(this,primitive_boxes,startIndex,endIndex);
    iVar10 = _sort_and_calc_splitting_index(this_00,primitive_boxes,startIndex,endIndex,iVar10);
    if (startIndex < endIndex) {
      auVar13._8_4_ = 0xff7fffff;
      auVar13._0_8_ = 0xff7fffffff7fffff;
      auVar13._12_4_ = 0xff7fffff;
      auVar15._8_4_ = 0x7f7fffff;
      auVar15._0_8_ = 0x7f7fffff7f7fffff;
      auVar15._12_4_ = 0x7f7fffff;
      auVar14 = ZEXT464(0xff7fffff);
      auVar16 = ZEXT464(0x7f7fffff);
      lVar12 = (long)endIndex - (long)startIndex;
      pcVar11 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data[startIndex].
                m_bound.m_max.m_floats + 2;
      do {
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)(pcVar11 + -6);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)((cbtVector3 *)(pcVar11 + -2))->m_floats;
        auVar6 = vminss_avx(ZEXT416((uint)pcVar11[-4]),auVar16._0_16_);
        auVar16 = ZEXT1664(auVar6);
        cVar3 = *pcVar11;
        auVar15 = vminps_avx(auVar17,auVar15);
        auVar13 = vmaxps_avx(auVar18,auVar13);
        pcVar11 = pcVar11 + 9;
        lVar12 = lVar12 + -1;
        auVar6 = vmaxss_avx(ZEXT416((uint)cVar3),auVar14._0_16_);
        auVar14 = ZEXT1664(auVar6);
      } while (lVar12 != 0);
    }
    else {
      auVar13._8_4_ = 0xff7fffff;
      auVar13._0_8_ = 0xff7fffffff7fffff;
      auVar13._12_4_ = 0xff7fffff;
      auVar15._8_4_ = 0x7f7fffff;
      auVar15._0_8_ = 0x7f7fffff7f7fffff;
      auVar15._12_4_ = 0x7f7fffff;
      auVar16 = ZEXT464(0x7f7fffff);
      auVar14 = ZEXT464(0xff7fffff);
    }
    lVar12 = *(long *)(this + 0x18);
    lVar7 = (long)iVar5 * 0x24;
    uVar4 = vmovlps_avx(auVar15);
    *(undefined8 *)(lVar12 + lVar7) = uVar4;
    *(int *)(lVar12 + 8 + lVar7) = auVar16._0_4_;
    uVar4 = vmovlps_avx(auVar13);
    *(undefined8 *)(lVar12 + 0x10 + lVar7) = uVar4;
    *(int *)(lVar12 + 0x18 + lVar7) = auVar14._0_4_;
    _build_sub_tree(this,primitive_boxes,startIndex,iVar10);
    _build_sub_tree(this,primitive_boxes,iVar10,endIndex);
    *(int *)(*(long *)(this + 0x18) + 0x20 + lVar7) = iVar5 - *(int *)this;
  }
  return;
}

Assistant:

void cbtBvhTree::_build_sub_tree(GIM_BVH_DATA_ARRAY& primitive_boxes, int startIndex, int endIndex)
{
	int curIndex = m_num_nodes;
	m_num_nodes++;

	cbtAssert((endIndex - startIndex) > 0);

	if ((endIndex - startIndex) == 1)
	{
		//We have a leaf node
		setNodeBound(curIndex, primitive_boxes[startIndex].m_bound);
		m_node_array[curIndex].setDataIndex(primitive_boxes[startIndex].m_data);

		return;
	}
	//calculate Best Splitting Axis and where to split it. Sort the incoming 'leafNodes' array within range 'startIndex/endIndex'.

	//split axis
	int splitIndex = _calc_splitting_axis(primitive_boxes, startIndex, endIndex);

	splitIndex = _sort_and_calc_splitting_index(
		primitive_boxes, startIndex, endIndex,
		splitIndex  //split axis
	);

	//calc this node bounding box

	cbtAABB node_bound;
	node_bound.invalidate();

	for (int i = startIndex; i < endIndex; i++)
	{
		node_bound.merge(primitive_boxes[i].m_bound);
	}

	setNodeBound(curIndex, node_bound);

	//build left branch
	_build_sub_tree(primitive_boxes, startIndex, splitIndex);

	//build right branch
	_build_sub_tree(primitive_boxes, splitIndex, endIndex);

	m_node_array[curIndex].setEscapeIndex(m_num_nodes - curIndex);
}